

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O3

Subpalette * __thiscall sfc::Palette::add_subpalette(Palette *this)

{
  runtime_error *this_00;
  Subpalette local_60;
  
  if (((long)(this->_subpalettes).
             super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->_subpalettes).
             super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
             super__Vector_impl_data._M_start >> 4) * -0x3333333333333333 -
      (ulong)this->_max_subpalettes != 0) {
    local_60._mode = this->_mode;
    local_60._max_colors = this->_max_colors_per_subpalette;
    local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_header;
    local_60._colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_60._colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60._colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::emplace_back<sfc::Subpalette>
              (&this->_subpalettes,&local_60);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_60._colors_set._M_t);
    if (local_60._colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60._colors.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60._colors.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60._colors.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return (this->_subpalettes).
           super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Colors don\'t fit in palette");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Subpalette& Palette::add_subpalette() {
  if (_max_subpalettes - _subpalettes.size() == 0)
    throw std::runtime_error("Colors don't fit in palette");
  _subpalettes.emplace_back(Subpalette(_mode, _max_colors_per_subpalette));
  Subpalette& sp = _subpalettes.back();
  return sp;
}